

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edk2_vss2.cpp
# Opt level: O0

void __thiscall
edk2_vss2_t::vss2_variable_t::vss2_variable_t
          (vss2_variable_t *this,kstream *p__io,vss2_store_body_t *p__parent,edk2_vss2_t *p__root)

{
  edk2_vss2_t *p__root_local;
  vss2_store_body_t *p__parent_local;
  kstream *p__io_local;
  vss2_variable_t *this_local;
  
  kaitai::kstruct::kstruct(&this->super_kstruct,p__io);
  (this->super_kstruct)._vptr_kstruct = (_func_int **)&PTR__vss2_variable_t_0026fe00;
  std::__cxx11::string::string((string *)&this->m_invoke_offset);
  std::
  unique_ptr<edk2_vss2_t::vss2_variable_attributes_t,std::default_delete<edk2_vss2_t::vss2_variable_attributes_t>>
  ::unique_ptr<std::default_delete<edk2_vss2_t::vss2_variable_attributes_t>,void>
            ((unique_ptr<edk2_vss2_t::vss2_variable_attributes_t,std::default_delete<edk2_vss2_t::vss2_variable_attributes_t>>
              *)&this->m_attributes);
  std::__cxx11::string::string((string *)&this->m_timestamp);
  std::__cxx11::string::string((string *)&this->m_vendor_guid);
  std::__cxx11::string::string((string *)&this->m_name_auth);
  std::__cxx11::string::string((string *)&this->m_data_auth);
  std::__cxx11::string::string((string *)&this->m_invoke_end_offset_auth);
  std::__cxx11::string::string((string *)&this->m_alignment_padding_auth);
  std::__cxx11::string::string((string *)&this->m_name);
  std::__cxx11::string::string((string *)&this->m_data);
  std::__cxx11::string::string((string *)&this->m_invoke_end_offset);
  std::__cxx11::string::string((string *)&this->m_alignment_padding);
  this->m__parent = p__parent;
  this->m__root = p__root;
  std::
  unique_ptr<edk2_vss2_t::vss2_variable_attributes_t,_std::default_delete<edk2_vss2_t::vss2_variable_attributes_t>_>
  ::operator=(&this->m_attributes,(nullptr_t)0x0);
  this->f_is_auth = false;
  this->f_len_standard_header = false;
  this->f_end_offset_auth = false;
  this->f_len_alignment_padding = false;
  this->f_len_auth_header = false;
  this->f_end_offset = false;
  this->f_len_alignment_padding_auth = false;
  this->f_is_valid = false;
  this->f_offset = false;
  _read(this);
  return;
}

Assistant:

edk2_vss2_t::vss2_variable_t::vss2_variable_t(kaitai::kstream* p__io, edk2_vss2_t::vss2_store_body_t* p__parent, edk2_vss2_t* p__root) : kaitai::kstruct(p__io) {
    m__parent = p__parent;
    m__root = p__root;
    m_attributes = nullptr;
    f_is_auth = false;
    f_len_standard_header = false;
    f_end_offset_auth = false;
    f_len_alignment_padding = false;
    f_len_auth_header = false;
    f_end_offset = false;
    f_len_alignment_padding_auth = false;
    f_is_valid = false;
    f_offset = false;
    _read();
}